

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_lwm_mips64el(CPUMIPSState_conflict5 *env,target_ulong addr,target_ulong reglist,
                        uint32_t mem_idx)

{
  uint32_t uVar1;
  abi_ptr addr_00;
  uint uVar2;
  ulong uVar3;
  uintptr_t unaff_retaddr;
  
  uVar2 = (uint)reglist & 0xf;
  addr_00 = addr;
  if ((ulong)uVar2 - 1 < 9) {
    for (uVar3 = 0; addr_00 = addr + uVar3, uVar2 << 2 != uVar3; uVar3 = uVar3 + 4) {
      uVar1 = cpu_ldl_mmuidx_ra_mips64el
                        ((CPUArchState_conflict14 *)env,addr_00,mem_idx,unaff_retaddr);
      (env->active_tc).gpr[*(int *)((long)multiple_regs + uVar3)] = (ulong)uVar1;
    }
  }
  if ((reglist & 0x10) != 0) {
    uVar1 = cpu_ldl_mmuidx_ra_mips64el((CPUArchState_conflict14 *)env,addr_00,mem_idx,unaff_retaddr)
    ;
    (env->active_tc).gpr[0x1f] = (ulong)uVar1;
  }
  return;
}

Assistant:

void helper_lwm(CPUMIPSState *env, target_ulong addr, target_ulong reglist,
                uint32_t mem_idx)
{
    target_ulong base_reglist = reglist & 0xf;
    target_ulong do_r31 = reglist & 0x10;

    if (base_reglist > 0 && base_reglist <= ARRAY_SIZE(multiple_regs)) {
        target_ulong i;

        for (i = 0; i < base_reglist; i++) {
            env->active_tc.gpr[multiple_regs[i]] =
                (target_long)cpu_ldl_mmuidx_ra(env, addr, mem_idx, GETPC());
            addr += 4;
        }
    }

    if (do_r31) {
        env->active_tc.gpr[31] =
            (target_long)cpu_ldl_mmuidx_ra(env, addr, mem_idx, GETPC());
    }
}